

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O2

void __thiscall
OptionRecordString::OptionRecordString
          (OptionRecordString *this,string *Xname,string *Xdescription,bool Xadvanced,
          string *Xvalue_pointer,string *Xdefault_value)

{
  string sStack_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)Xname);
  std::__cxx11::string::string((string *)&sStack_68,(string *)Xdescription);
  OptionRecord::OptionRecord(&this->super_OptionRecord,kString,&local_48,&sStack_68,Xadvanced);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_OptionRecord)._vptr_OptionRecord = (_func_int **)&PTR__OptionRecordString_00432ca0;
  (this->default_value)._M_dataplus._M_p = (pointer)&(this->default_value).field_2;
  (this->default_value)._M_string_length = 0;
  (this->default_value).field_2._M_local_buf[0] = '\0';
  this->value = Xvalue_pointer;
  std::__cxx11::string::_M_assign((string *)&this->default_value);
  std::__cxx11::string::_M_assign((string *)this->value);
  return;
}

Assistant:

OptionRecordString(std::string Xname, std::string Xdescription,
                     bool Xadvanced, std::string* Xvalue_pointer,
                     std::string Xdefault_value)
      : OptionRecord(HighsOptionType::kString, Xname, Xdescription, Xadvanced) {
    value = Xvalue_pointer;
    default_value = Xdefault_value;
    *value = default_value;
  }